

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_mcode.c
# Opt level: O3

void mcode_allocarea(jit_State *J)

{
  MCode *pMVar1;
  uint uVar2;
  long *base;
  uint8_t *puVar3;
  MCode *__addr;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong __len;
  
  pMVar1 = J->mcarea;
  uVar5 = (long)J->param[0xd] * 0x400 + 0xfff;
  __len = uVar5 & 0xfffffffffffff000;
  __addr = pMVar1 + -__len;
  if (pMVar1 == (MCode *)0x0) {
    __addr = (MCode *)0x0;
  }
  iVar6 = 0;
  do {
    if (__addr != (MCode *)0x0) {
      base = (long *)mmap64(__addr,__len,3,0x22,-1,0);
      if (1 < (long)base + 1U) {
        if (((long)base + (__len - 0x100000) < 0x3fe00000) || (0x100000U - (long)base < 0x3fe00000))
        {
          J->mcarea = (MCode *)base;
          J->szmcarea = __len;
          J->mcprot = 3;
          J->mctop = (MCode *)((long)base + __len);
          J->mcbot = (MCode *)(base + 2);
          *base = (long)pMVar1;
          base[1] = __len;
          J->szallmcarea = J->szallmcarea + __len;
          puVar3 = lj_err_register_mcode(base,__len,(uint8_t *)(base + 2));
          J->mcbot = puVar3;
          return;
        }
        munmap(base,__len);
      }
    }
    uVar2 = J->prngstate;
    do {
      uVar2 = uVar2 * 0x41c64e6d + 0x3039;
      uVar4 = (ulong)(uVar2 >> 1 & 0x7fff0000);
    } while (0x7fbfffff < uVar5 + uVar4);
    J->prngstate = uVar2;
    __addr = (MCode *)(uVar4 - 0x3fd00000);
    iVar6 = iVar6 + 1;
  } while (iVar6 != 0x1f);
  lj_trace_err(J,LJ_TRERR_MCODEAL);
}

Assistant:

static void mcode_allocarea(jit_State *J)
{
  MCode *oldarea = J->mcarea;
  size_t sz = (size_t)J->param[JIT_P_sizemcode] << 10;
  sz = (sz + LJ_PAGESIZE-1) & ~(size_t)(LJ_PAGESIZE - 1);
  J->mcarea = (MCode *)mcode_alloc(J, sz);
  J->szmcarea = sz;
  J->mcprot = MCPROT_GEN;
  J->mctop = (MCode *)((char *)J->mcarea + J->szmcarea);
  J->mcbot = (MCode *)((char *)J->mcarea + sizeof(MCLink));
  ((MCLink *)J->mcarea)->next = oldarea;
  ((MCLink *)J->mcarea)->size = sz;
  J->szallmcarea += sz;
  J->mcbot = (MCode *)lj_err_register_mcode(J->mcarea, sz, (uint8_t *)J->mcbot);
}